

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingcategory.cpp
# Opt level: O2

bool __thiscall QLoggingCategory::isEnabled(QLoggingCategory *this,QtMsgType msgtype)

{
  byte bVar1;
  
  bVar1 = 1;
  switch(msgtype) {
  case QtDebugMsg:
    bVar1 = (this->field_2).bools.enabledDebug._q_value._M_base._M_i;
    break;
  case QtWarningMsg:
    bVar1 = (this->field_2).bools.enabledWarning._q_value._M_base._M_i;
    break;
  case QtCriticalMsg:
    bVar1 = (this->field_2).bools.enabledCritical._q_value._M_base._M_i;
    break;
  case QtFatalMsg:
    break;
  case QtInfoMsg:
    bVar1 = (this->field_2).bools.enabledInfo._q_value._M_base._M_i;
    break;
  default:
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool QLoggingCategory::isEnabled(QtMsgType msgtype) const
{
    switch (msgtype) {
    case QtDebugMsg: return isDebugEnabled();
    case QtInfoMsg: return isInfoEnabled();
    case QtWarningMsg: return isWarningEnabled();
    case QtCriticalMsg: return isCriticalEnabled();
    case QtFatalMsg: return true;
    }
    return false;
}